

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::MaxShaderCompileThreadsTest::iterate(MaxShaderCompileThreadsTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint intValue;
  int local_24;
  long lVar4;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_parallel_shader_compile");
  if (bVar1) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar4 + 0xdb0))(0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"maxShaderCompilerThreadsARB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x9d);
    (**(code **)(lVar4 + 0x868))(0x91b0,&local_24);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"getIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xa0);
    if (local_24 == 0) {
      (**(code **)(lVar4 + 0xdb0))(0xffffffff);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"maxShaderCompilerThreadsARB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0xa9);
      (**(code **)(lVar4 + 0x868))(0x91b0,&local_24);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"getIntegerv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0xac);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (local_24 == -1) {
        description = "Pass";
      }
      else {
        description = "Failed to set maximum shader compiler threads.";
      }
    }
    else {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Failed to disable parallel shader compilation.";
    }
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MaxShaderCompileThreadsTest::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_parallel_shader_compile"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLint intValue;

	gl.maxShaderCompilerThreadsARB(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "maxShaderCompilerThreadsARB");

	gl.getIntegerv(GL_MAX_SHADER_COMPILER_THREADS_ARB, &intValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv");

	if (intValue != 0)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Failed to disable parallel shader compilation.");
		return STOP;
	}

	gl.maxShaderCompilerThreadsARB(0xFFFFFFFF);
	GLU_EXPECT_NO_ERROR(gl.getError(), "maxShaderCompilerThreadsARB");

	gl.getIntegerv(GL_MAX_SHADER_COMPILER_THREADS_ARB, &intValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv");

	if (intValue != GLint(0xFFFFFFFF))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Failed to set maximum shader compiler threads.");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}